

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O3

void __thiscall luna::State::CallClosure(State *this,Value *f,int expect_result)

{
  size_t *psVar1;
  bool bVar2;
  uint uVar3;
  Function *this_00;
  _List_node_base *p_Var4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  _List_node_base *p_Var8;
  uint uVar9;
  ulong uVar10;
  CallInfo callee;
  CallInfo local_58;
  
  CallInfo::CallInfo(&local_58);
  this_00 = Closure::GetPrototype((f->field_0).closure_);
  local_58.func_ = f;
  p_Var4 = (_List_node_base *)Function::GetOpCodes(this_00);
  local_58.instruction_ = (Instruction *)p_Var4;
  sVar5 = Function::OpCodeSize(this_00);
  local_58.end_ = (Instruction *)((long)&p_Var4->_M_next + sVar5 * 4);
  p_Var4 = (_List_node_base *)(f + 1);
  local_58.expect_result_ = expect_result;
  uVar3 = Function::FixedArgCount(this_00);
  bVar2 = Function::HasVararg(this_00);
  if (bVar2) {
    local_58.register_ = (this->stack_).top_;
    uVar6 = (ulong)((long)local_58.register_ - (long)p_Var4) >> 4;
    uVar10 = (ulong)uVar3;
    if ((int)uVar6 < (int)uVar3) {
      uVar10 = uVar6 & 0xffffffff;
    }
    if (0 < (int)uVar10) {
      lVar7 = 0;
      do {
        *(undefined4 *)((long)&((_List_node_base *)local_58.register_)->_M_prev + lVar7) =
             *(undefined4 *)((long)&f[1].type_ + lVar7);
        *(undefined8 *)((long)&((_List_node_base *)local_58.register_)->_M_next + lVar7) =
             *(undefined8 *)((long)&p_Var4->_M_next + lVar7);
        lVar7 = lVar7 + 0x10;
        uVar9 = (int)uVar10 - 1;
        uVar10 = (ulong)uVar9;
      } while (uVar9 != 0);
    }
  }
  else {
    for (p_Var8 = (_List_node_base *)(this->stack_).top_; local_58.register_ = (Value *)p_Var4,
        p_Var8 < p_Var4 + (int)uVar3; p_Var8 = p_Var8 + 1) {
      p_Var8->_M_next = (_List_node_base *)0x0;
      *(undefined4 *)&p_Var8->_M_prev = 0;
    }
  }
  Stack::SetNewTop(&this->stack_,(Value *)(local_58.register_ + (int)uVar3));
  p_Var4 = (_List_node_base *)operator_new(0x38);
  p_Var4[1]._M_next = (_List_node_base *)local_58.register_;
  p_Var4[1]._M_prev = (_List_node_base *)local_58.func_;
  p_Var4[2]._M_next = (_List_node_base *)local_58.instruction_;
  p_Var4[2]._M_prev = (_List_node_base *)local_58.end_;
  p_Var4[3]._M_next = (_List_node_base *)CONCAT44(local_58._36_4_,local_58.expect_result_);
  std::__detail::_List_node_base::_M_hook(p_Var4);
  psVar1 = &(this->calls_).super__List_base<luna::CallInfo,_std::allocator<luna::CallInfo>_>._M_impl
            ._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

void State::CallClosure(Value *f, int expect_result)
    {
        CallInfo callee;
        Function *callee_proto = f->closure_->GetPrototype();

        callee.func_ = f;
        callee.instruction_ = callee_proto->GetOpCodes();
        callee.end_ = callee.instruction_ + callee_proto->OpCodeSize();
        callee.expect_result_ = expect_result;

        Value *arg = f + 1;
        int fixed_args = callee_proto->FixedArgCount();

        // Fixed arg start from base register
        if (callee_proto->HasVararg())
        {
            Value *top = stack_.top_;
            callee.register_ = top;
            int count = top - arg;
            for (int i = 0; i < count && i < fixed_args; ++i)
                *top++ = *arg++;
        }
        else
        {
            callee.register_ = arg;
            // fill nil for overflow args
            auto new_top = callee.register_ + fixed_args;
            for (auto arg = stack_.top_; arg < new_top; arg++)
            {
                arg->SetNil();
            }
        }

        stack_.SetNewTop(callee.register_ + fixed_args);
        calls_.push_back(callee);
    }